

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
DensityCalculator<double,_float>::push_bdens_fast_route
          (DensityCalculator<double,_float> *this,double split_point,size_t col)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  DensityCalculator<double,_float> *pDVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  DensityCalculator<double,_float> *pDVar4;
  reference pvVar5;
  size_type in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_XMM0_Qa;
  value_type_conflict *__x;
  double dVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> *this_00;
  DensityCalculator<double,_float> *this_01;
  undefined4 uVar8;
  undefined4 uVar9;
  double fraction_right;
  double fraction_left;
  double curr_range;
  vector<double,_std::allocator<double>_> *this_02;
  
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),in_RSI);
  dVar6 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),in_RSI);
  dVar7 = *pvVar5;
  this_02 = in_XMM0_Qa;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),in_RSI);
  __x = (value_type_conflict *)(((double)this_02 - *pvVar5) / (dVar6 - dVar7));
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),in_RSI);
  dVar6 = (*pvVar5 - (double)in_XMM0_Qa) / (dVar6 - dVar7);
  dVar7 = std::numeric_limits<double>::min();
  uVar8 = SUB84(dVar7,0);
  uVar9 = (int)((ulong)dVar7 >> 0x20);
  if (dVar7 <= (double)__x) {
    uVar8 = (int)__x;
    uVar9 = (int)((ulong)__x >> 0x20);
  }
  this_00 = (vector<double,_std::allocator<double>_> *)
            (~-(ulong)NAN((double)__x) & CONCAT44(uVar9,uVar8) |
            -(ulong)NAN((double)__x) & (ulong)dVar7);
  dVar7 = std::numeric_limits<double>::epsilon();
  pvVar1 = (vector<double,_std::allocator<double>_> *)(1.0 - dVar7);
  pvVar3 = pvVar1;
  if ((double)this_00 <= (double)pvVar1) {
    pvVar3 = this_00;
  }
  log((double)(~-(ulong)NAN((double)this_00) & (ulong)pvVar3 |
              -(ulong)NAN((double)this_00) & (ulong)pvVar1));
  std::vector<double,_std::allocator<double>_>::back(this_02);
  dVar7 = std::numeric_limits<double>::min();
  uVar8 = SUB84(dVar7,0);
  uVar9 = (int)((ulong)dVar7 >> 0x20);
  if (dVar7 <= dVar6) {
    uVar8 = SUB84(dVar6,0);
    uVar9 = (int)((ulong)dVar6 >> 0x20);
  }
  this_01 = (DensityCalculator<double,_float> *)
            (~-(ulong)NAN(dVar6) & CONCAT44(uVar9,uVar8) | -(ulong)NAN(dVar6) & (ulong)dVar7);
  dVar7 = std::numeric_limits<double>::epsilon();
  pDVar2 = (DensityCalculator<double,_float> *)(1.0 - dVar7);
  pDVar4 = pDVar2;
  if ((double)this_01 <= (double)pDVar2) {
    pDVar4 = this_01;
  }
  log((double)(~-(ulong)NAN((double)this_01) & (ulong)pDVar4 |
              -(ulong)NAN((double)this_01) & (ulong)pDVar2));
  std::vector<double,_std::allocator<double>_>::back(this_02);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,__x);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,__x);
  push_bdens_internal(this_01,dVar6,(size_t)this_00);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_bdens_fast_route(double split_point, size_t col)
{
    ldouble_safe curr_range = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
    ldouble_safe fraction_left  =  ((ldouble_safe)split_point - (ldouble_safe)this->box_low[col]) / curr_range;
    ldouble_safe fraction_right = ((ldouble_safe)this->box_high[col] - (ldouble_safe)split_point) / curr_range;
    fraction_left   = std::fmax(fraction_left, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_left   = std::fmin(fraction_left, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_left   = std::log(fraction_left);
    fraction_left  += this->multipliers.back();
    fraction_right  = std::fmax(fraction_right, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_right  = std::fmin(fraction_right, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_right  = std::log(fraction_right);
    fraction_right += this->multipliers.back();
    this->multipliers.push_back(fraction_right);
    this->multipliers.push_back(fraction_left);

    this->push_bdens_internal(split_point, col);
}